

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O3

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  long lVar8;
  pointer pbVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  int retVal;
  string output_variable;
  string arguments;
  string return_variable;
  string coutput;
  string command;
  string output;
  int local_14c;
  uint local_144;
  cmCommand *local_140;
  string local_138;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  string local_f8;
  string local_d8 [3];
  char *local_70;
  undefined8 local_68;
  char local_60;
  undefined7 uStack_5f;
  string local_50;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar9) {
    local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
      operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    local_118 = &local_108;
    lVar8 = 0;
    local_110 = 0;
    local_108 = 0;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    uVar10 = 0;
    bVar12 = false;
    local_14c = 0;
    bVar3 = false;
    local_140 = &this->super_cmCommand;
    bVar11 = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)((long)&(pbVar9->_M_dataplus)._M_p + lVar8));
      if (iVar4 == 0) {
        local_14c = local_14c + 1;
        pcVar6 = extraout_RDX;
LAB_003b12a2:
        bVar3 = false;
LAB_003b12aa:
        bVar12 = false;
      }
      else if (bVar11) {
        if (local_138._M_string_length != 0) {
          local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"called with incorrect number of arguments","");
          cmCommand::SetError(local_140,local_d8);
LAB_003b16a1:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
            operator_delete(local_d8[0]._M_dataplus._M_p,
                            local_d8[0].field_2._M_allocated_capacity + 1);
          }
          bVar3 = false;
          goto LAB_003b16c0;
        }
        std::__cxx11::string::_M_assign((string *)&local_138);
        local_14c = local_14c + 1;
        pcVar6 = extraout_RDX_00;
      }
      else {
        iVar5 = std::__cxx11::string::compare
                          ((char *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar8));
        if (iVar5 != 0) {
          if (bVar12) {
            if (local_f8._M_string_length != 0) {
              local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_d8,"called with incorrect number of arguments","");
              cmCommand::SetError(local_140,local_d8);
              goto LAB_003b16a1;
            }
            std::__cxx11::string::_M_assign((string *)&local_f8);
            local_14c = local_14c + 1;
            pcVar6 = extraout_RDX_02;
          }
          else {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((long)&(((args->
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)->
                                               _M_dataplus)._M_p + lVar8));
            pcVar6 = extraout_RDX_03;
            if (iVar5 != 0) {
              if (!bVar3) goto LAB_003b12a2;
              std::__cxx11::string::_M_append
                        ((char *)&local_118,
                         *(ulong *)((long)&(((args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar8));
              std::__cxx11::string::append((char *)&local_118);
              pcVar6 = extraout_RDX_04;
            }
            local_14c = local_14c + 1;
            bVar3 = true;
          }
          goto LAB_003b12aa;
        }
        local_14c = local_14c + 1;
        bVar12 = true;
        bVar3 = false;
        pcVar6 = extraout_RDX_01;
      }
      uVar10 = uVar10 + 1;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
      bVar11 = iVar4 == 0;
    } while (uVar10 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5)
            );
    local_68 = 0;
    local_60 = '\0';
    local_70 = &local_60;
    if (local_110 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
    else {
      cmSystemTools::ConvertToRunCommandPath_abi_cxx11_
                (local_d8,(cmSystemTools *)(pbVar9->_M_dataplus)._M_p,pcVar6);
      std::__cxx11::string::operator=((string *)&local_70,(string *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
        operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_118);
    }
    sVar2 = local_138._M_string_length;
    local_144 = 0;
    paVar1 = &local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    pbVar9 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5) - (long)local_14c ==
        2) {
      cmsys::SystemTools::MakeDirectory(pbVar9[1]._M_dataplus._M_p);
      pcVar6 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    }
    else {
      pcVar6 = (char *)0x0;
    }
    bVar3 = RunCommand(local_70,&local_50,(int *)&local_144,pcVar6,sVar2 == 0);
    if (!bVar3) {
      local_144 = 0xffffffff;
    }
    if (local_138._M_string_length != 0) {
      uVar10 = std::__cxx11::string::find_first_not_of((char *)&local_50,0x5a2b54,0);
      lVar8 = std::__cxx11::string::find_last_not_of((char *)&local_50,0x5a2b54,0xffffffffffffffff);
      if (uVar10 == 0xffffffffffffffff) {
        uVar10 = 0;
      }
      lVar7 = local_50._M_string_length - 1;
      if (lVar8 != -1) {
        lVar7 = lVar8;
      }
      std::__cxx11::string::string
                ((string *)local_d8,(string *)&local_50,uVar10,(lVar7 - uVar10) + 1);
      cmMakefile::AddDefinition(local_140->Makefile,&local_138,local_d8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
        operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
      }
    }
    if (local_f8._M_string_length != 0) {
      sprintf((char *)local_d8,"%d",(ulong)local_144);
      cmMakefile::AddDefinition(local_140->Makefile,&local_f8,(char *)local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    bVar3 = true;
LAB_003b16c0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    if (local_118 != &local_108) {
      operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool cmExecProgramCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "OUTPUT_VARIABLE")
      {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
      }
    else if ( haveoutput_variable )
      {
      if (!output_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      output_variable = args[i];
      haveoutput_variable = false;
      count ++;
      }
    else if(args[i] == "RETURN_VALUE")
      {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
      }
    else if ( havereturn_variable )
      {
      if (!return_variable.empty())
        {
        this->SetError("called with incorrect number of arguments");
        return false;
        }
      return_variable = args[i];
      havereturn_variable = false;
      count ++;
      }
    else if(args[i] == "ARGS")
      {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
      }
    else if(doingargs)
      {
      arguments += args[i];
      arguments += " ";
      count++;
      }
    }

  std::string command;
  if(!arguments.empty())
    {
    command = cmSystemTools::ConvertToRunCommandPath(args[0].c_str());
    command += " ";
    command += arguments;
    }
  else
    {
    command = args[0];
    }
  bool verbose = true;
  if(!output_variable.empty())
    {
    verbose = false;
    }
  int retVal = 0;
  std::string output;
  bool result = true;
  if(args.size() - count == 2)
    {
    cmSystemTools::MakeDirectory(args[1].c_str());
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              args[1].c_str(), verbose);
    }
  else
    {
    result = cmExecProgramCommand::RunCommand(command.c_str(), output,
                                              retVal, 0, verbose);
    }
  if(!result)
    {
    retVal = -1;
    }

  if (!output_variable.empty())
    {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if(first == std::string::npos)
      {
      first = 0;
      }
    if(last == std::string::npos)
      {
      last = output.size()-1;
      }

    std::string coutput = std::string(output, first, last-first+1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
    }

  if (!return_variable.empty())
    {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
    }

  return true;
}